

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O2

int platform_make_x11_server
              (Plug *plug,char *progname,int mindisp,char *screen_number_suffix,ptrlen authproto,
              ptrlen authdata,Socket **sockets,Conf *conf)

{
  int iVar1;
  __mode_t __mask;
  int iVar2;
  __pid_t _Var3;
  strbuf *buf_o;
  Socket *pSVar4;
  char *pcVar5;
  char *pcVar6;
  SockAddr *addr;
  SockAddr *listenaddr;
  FILE *__s;
  char *value;
  ssize_t sVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int cleanup_pipe [2];
  char *canonicalname;
  
  buf_o = strbuf_new_nm();
  uVar10 = 1;
  do {
    pSVar4 = new_listener((char *)0x0,mindisp + 6000,plug,false,conf,1);
    *sockets = pSVar4;
    pcVar5 = (*pSVar4->vt->socket_error)(pSVar4);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = get_hostname();
      if (pcVar5 == (char *)0x0) {
        addr = (SockAddr *)0x0;
      }
      else {
        canonicalname = (char *)0x0;
        addr = sk_namelookup(pcVar5,&canonicalname,1);
        safefree(canonicalname);
      }
      safefree(pcVar5);
      if (addr != (SockAddr *)0x0) {
        x11_format_auth_for_authfile(buf_o->binarysink_,addr,mindisp,authproto,authdata);
      }
      pcVar5 = dupprintf("/tmp/.X11-unix/X%d",(ulong)(uint)mindisp);
      listenaddr = unix_sock_addr(pcVar5);
      pSVar4 = new_unix_listener(listenaddr,plug);
      sockets[1] = pSVar4;
      pcVar6 = (*pSVar4->vt->socket_error)(pSVar4);
      if (pcVar6 == (char *)0x0) {
        uVar10 = 2;
        x11_format_auth_for_authfile(buf_o->binarysink_,listenaddr,mindisp,authproto,authdata);
      }
      else {
        (*sockets[1]->vt->close)(sockets[1]);
        safefree(pcVar5);
        pcVar5 = (char *)0x0;
      }
      pcVar6 = getenv("TMPDIR");
      if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
        pcVar6 = "/tmp";
      }
      pcVar6 = dupcat_fn(pcVar6,"/",progname,"-Xauthority-XXXXXX",0);
      __mask = umask(0x3f);
      iVar1 = mkstemp(pcVar6);
      umask(__mask);
      if (iVar1 < 0) {
        uVar9 = 0xffffffff;
        for (uVar8 = (ulong)uVar10; 0 < (long)uVar8; uVar8 = uVar8 - 1) {
          (*sockets[uVar8 - 1]->vt->close)(sockets[uVar8 - 1]);
        }
      }
      else {
        iVar2 = pipe(cleanup_pipe);
        if (iVar2 == 0) {
          _Var3 = fork();
          if (_Var3 == 0) {
            close(0);
            close(1);
            close(2);
            setpgid(0,0);
            close(cleanup_pipe[1]);
            close(iVar1);
            do {
              sVar7 = read(cleanup_pipe[0],&canonicalname,0x1000);
            } while (0 < sVar7);
            unlink(pcVar6);
            if (pcVar5 != (char *)0x0) {
              unlink(pcVar5);
            }
            _exit(0);
          }
          close(cleanup_pipe[0]);
          if (_Var3 < 0) {
            close(cleanup_pipe[1]);
          }
          else {
            cloexec(cleanup_pipe[1]);
          }
        }
        __s = fdopen(iVar1,"wb");
        fwrite(buf_o->u,1,buf_o->len,__s);
        fclose(__s);
        value = dupprintf(":%d%s",(ulong)(uint)mindisp,screen_number_suffix);
        conf_set_str_str(conf,0x38,"DISPLAY",value);
        safefree(value);
        conf_set_str_str(conf,0x38,"XAUTHORITY",pcVar6);
        uVar9 = uVar10;
      }
      if (addr != (SockAddr *)0x0) {
        sk_addr_free(addr);
      }
LAB_0010c0ea:
      safefree(pcVar6);
      strbuf_free(buf_o);
      safefree(pcVar5);
      return uVar9;
    }
    (*(*sockets)->vt->close)(*sockets);
    pcVar6 = strerror(0x62);
    iVar1 = strcmp(pcVar5,pcVar6);
    if (iVar1 != 0) {
      pcVar6 = (char *)0x0;
      pcVar5 = (char *)0x0;
      uVar9 = 0;
      goto LAB_0010c0ea;
    }
    mindisp = mindisp + 1;
  } while( true );
}

Assistant:

int platform_make_x11_server(Plug *plug, const char *progname, int mindisp,
                             const char *screen_number_suffix,
                             ptrlen authproto, ptrlen authdata,
                             Socket **sockets, Conf *conf)
{
    char *tmpdir;
    char *authfilename = NULL;
    strbuf *authfiledata = NULL;
    char *unix_path = NULL;

    SockAddr *a_tcp = NULL, *a_unix = NULL;

    int authfd;
    FILE *authfp;

    int displayno;

    authfiledata = strbuf_new_nm();

    int nsockets = 0;

    /*
     * Look for a free TCP port to run our server on.
     */
    for (displayno = mindisp;; displayno++) {
        const char *err;
        int tcp_port = displayno + 6000;
        int addrtype = ADDRTYPE_IPV4;

        sockets[nsockets] = new_listener(
            NULL, tcp_port, plug, false, conf, addrtype);

        err = sk_socket_error(sockets[nsockets]);
        if (!err) {
            char *hostname = get_hostname();
            if (hostname) {
                char *canonicalname = NULL;
                a_tcp = sk_namelookup(hostname, &canonicalname, addrtype);
                sfree(canonicalname);
            }
            sfree(hostname);
            nsockets++;
            break;                     /* success! */
        } else {
            sk_close(sockets[nsockets]);
        }

        /*
         * If we weren't able to bind to this port because it's in use
         * by another program, go round this loop and try again. But
         * for any other reason, give up completely and return failure
         * to our caller.
         *
         * sk_socket_error currently has no machine-readable component
         * (it would need a cross-platform abstraction of the socket
         * error types we care about, plus translation from each OS
         * error enumeration into that). So we use the disgusting
         * approach of a string compare between the error string and
         * the one EADDRINUSE would have given :-(
         */
        if (strcmp(err, strerror(EADDRINUSE)))
            goto out;
    }

    if (a_tcp) {
        x11_format_auth_for_authfile(
            BinarySink_UPCAST(authfiledata),
            a_tcp, displayno, authproto, authdata);
    }

    /*
     * Try to establish the Unix-domain analogue. That may or may not
     * work - file permissions in /tmp may prevent it, for example -
     * but it's worth a try, and we don't consider it a fatal error if
     * it doesn't work.
     */
    unix_path = dupprintf("/tmp/.X11-unix/X%d", displayno);
    a_unix = unix_sock_addr(unix_path);

    sockets[nsockets] = new_unix_listener(a_unix, plug);
    if (!sk_socket_error(sockets[nsockets])) {
        x11_format_auth_for_authfile(
            BinarySink_UPCAST(authfiledata),
            a_unix, displayno, authproto, authdata);
        nsockets++;
    } else {
        sk_close(sockets[nsockets]);
        sfree(unix_path);
        unix_path = NULL;
    }

    /*
     * Decide where the authority data will be written.
     */

    tmpdir = getenv("TMPDIR");
    if (!tmpdir || !*tmpdir)
        tmpdir = "/tmp";

    authfilename = dupcat(tmpdir, "/", progname, "-Xauthority-XXXXXX");

    {
        int oldumask = umask(077);
        authfd = mkstemp(authfilename);
        umask(oldumask);
    }
    if (authfd < 0) {
        while (nsockets-- > 0)
            sk_close(sockets[nsockets]);
        goto out;
    }

    /*
     * Spawn a subprocess which will try to reliably delete our
     * auth file when we terminate, in case we die unexpectedly.
     */
    {
        int cleanup_pipe[2];
        pid_t pid;

        /* Don't worry if pipe or fork fails; it's not _that_ critical. */
        if (!pipe(cleanup_pipe)) {
            if ((pid = fork()) == 0) {
                int buf[1024];
                /*
                 * Our parent process holds the writing end of
                 * this pipe, and writes nothing to it. Hence,
                 * we expect read() to return EOF as soon as
                 * that process terminates.
                 */

                close(0);
                close(1);
                close(2);

                setpgid(0, 0);
                close(cleanup_pipe[1]);
                close(authfd);
                while (read(cleanup_pipe[0], buf, sizeof(buf)) > 0);
                unlink(authfilename);
                if (unix_path)
                    unlink(unix_path);
                _exit(0);
            } else if (pid < 0) {
                close(cleanup_pipe[0]);
                close(cleanup_pipe[1]);
            } else {
                close(cleanup_pipe[0]);
                cloexec(cleanup_pipe[1]);
            }
        }
    }

    authfp = fdopen(authfd, "wb");
    fwrite(authfiledata->u, 1, authfiledata->len, authfp);
    fclose(authfp);

    {
        char *display = dupprintf(":%d%s", displayno, screen_number_suffix);
        conf_set_str_str(conf, CONF_environmt, "DISPLAY", display);
        sfree(display);
    }
    conf_set_str_str(conf, CONF_environmt, "XAUTHORITY", authfilename);

    /*
     * FIXME: return at least the DISPLAY and XAUTHORITY env settings,
     * and perhaps also the display number
     */

  out:
    if (a_tcp)
        sk_addr_free(a_tcp);
    /* a_unix doesn't need freeing, because new_unix_listener took it over */
    sfree(authfilename);
    strbuf_free(authfiledata);
    sfree(unix_path);
    return nsockets;
}